

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer *this_00;
  DiagLevel DVar1;
  bool bVar2;
  bool bVar3;
  CacheEntryType CVar4;
  size_type sVar5;
  long lVar6;
  ulong uVar7;
  const_reference pvVar8;
  string *psVar9;
  char *pcVar10;
  ostream *poVar11;
  mapped_type *pmVar12;
  DiagLevel *pDVar13;
  reference pbVar14;
  undefined1 local_308 [8];
  string path_1;
  string path;
  string *currentEntry;
  iterator __end5_1;
  iterator __begin5_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5_1;
  CacheEntryType t;
  string *ck;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  undefined1 local_230 [8];
  RegularExpression regex;
  string entryPattern;
  string local_138 [32];
  int local_118;
  byte local_112;
  byte local_111;
  uint nameStartPosition;
  bool foundError;
  bool foundNo;
  string name;
  string entry_1;
  string *v;
  string cachedValue;
  undefined1 local_a0 [3];
  bool haveValue;
  CacheEntryType type;
  string value;
  string var;
  undefined1 local_50 [8];
  string entry;
  string *arg;
  uint i;
  bool findPackageMode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  bVar2 = false;
  arg._0_4_ = 1;
  do {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar5 <= (uint)arg) {
      if (bVar2) {
        this_local._7_1_ = FindPackage(this,args);
      }
      else {
        this_local._7_1_ = 1;
      }
LAB_0024adbd:
      return (bool)(this_local._7_1_ & 1);
    }
    entry.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](args,(ulong)(uint)arg);
    lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0x7859a1);
    if (lVar6 == 0) {
      std::__cxx11::string::substr((ulong)local_50,entry.field_2._8_8_);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
LAB_0024a0be:
        std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_a0);
        cachedValue.field_2._12_4_ = 6;
        bVar3 = cmState::ParseCacheEntry
                          ((string *)local_50,(string *)(value.field_2._M_local_buf + 8),
                           (string *)local_a0,
                           (CacheEntryType *)(cachedValue.field_2._M_local_buf + 0xc));
        if (bVar3) {
          cachedValue.field_2._M_local_buf[0xb] = '\0';
          std::__cxx11::string::string((string *)&v);
          if (((this->WarnUnusedCli & 1U) != 0) &&
             (psVar9 = cmState::GetInitializedCacheValue
                                 (this->State,(string *)((long)&value.field_2 + 8)),
             psVar9 != (string *)0x0)) {
            cachedValue.field_2._M_local_buf[0xb] = '\x01';
            std::__cxx11::string::operator=((string *)&v,(string *)psVar9);
          }
          pcVar10 = (char *)std::__cxx11::string::c_str();
          AddCacheEntry(this,(string *)((long)&value.field_2 + 8),pcVar10,
                        "No help, variable specified on the command line.",
                        cachedValue.field_2._12_4_);
          if ((this->WarnUnusedCli & 1U) != 0) {
            if ((cachedValue.field_2._M_local_buf[0xb] & 1U) != 0) {
              psVar9 = cmState::GetInitializedCacheValue
                                 (this->State,(string *)((long)&value.field_2 + 8));
              bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&v,psVar9);
              if (!bVar3) goto LAB_0024a264;
            }
            WatchUnusedCli(this,(string *)((long)&value.field_2 + 8));
          }
LAB_0024a264:
          std::__cxx11::string::~string((string *)&v);
          bVar3 = false;
        }
        else {
          poVar11 = std::operator<<((ostream *)&std::cerr,"Parse error in command line argument: ");
          poVar11 = std::operator<<(poVar11,(string *)entry.field_2._8_8_);
          poVar11 = std::operator<<(poVar11,"\n");
          std::operator<<(poVar11,"Should be: VAR:type=value\n");
          cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar3 = true;
        }
        std::__cxx11::string::~string((string *)local_a0);
        std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      }
      else {
        arg._0_4_ = (uint)arg + 1;
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if ((uint)arg < sVar5) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)(uint)arg);
          std::__cxx11::string::operator=((string *)local_50,(string *)pvVar8);
          goto LAB_0024a0be;
        }
        cmSystemTools::Error
                  ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        this_local._7_1_ = 0;
        bVar3 = true;
      }
      std::__cxx11::string::~string((string *)local_50);
      if (bVar3) goto LAB_0024adbd;
    }
    else {
      bVar3 = cmHasLiteralPrefix<std::__cxx11::string,3ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         entry.field_2._8_8_,(char (*) [3])"-W");
      if (bVar3) {
        std::__cxx11::string::substr((ulong)((long)&name.field_2 + 8),entry.field_2._8_8_);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
LAB_0024a42c:
          std::__cxx11::string::string((string *)&nameStartPosition);
          local_111 = 0;
          local_112 = 0;
          local_118 = 0;
          lVar6 = std::__cxx11::string::find(name.field_2._M_local_buf + 8,0x785a7e);
          if (lVar6 == 0) {
            local_111 = 1;
            local_118 = local_118 + 3;
          }
          lVar6 = std::__cxx11::string::find(name.field_2._M_local_buf + 8,0x785a82);
          if (lVar6 == 0) {
            local_112 = 1;
            local_118 = local_118 + 6;
          }
          std::__cxx11::string::substr((ulong)local_138,(ulong)((long)&name.field_2 + 8));
          std::__cxx11::string::operator=((string *)&nameStartPosition,local_138);
          std::__cxx11::string::~string(local_138);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            if (((local_111 & 1) == 0) && ((local_112 & 1) == 0)) {
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
              entryPattern.field_2._12_4_ = 1;
              pDVar13 = std::max<cmake::DiagLevel>
                                  (pmVar12,(DiagLevel *)(entryPattern.field_2._M_local_buf + 0xc));
              DVar1 = *pDVar13;
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
              *pmVar12 = DVar1;
            }
            else if (((local_111 & 1) == 0) || ((local_112 & 1) != 0)) {
              if (((local_111 & 1) == 0) && ((local_112 & 1) != 0)) {
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
                *pmVar12 = DIAG_ERROR;
              }
              else {
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
                entryPattern.field_2._8_4_ = 1;
                pDVar13 = std::min<cmake::DiagLevel>
                                    (pmVar12,(DiagLevel *)(entryPattern.field_2._M_local_buf + 8));
                DVar1 = *pDVar13;
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
                *pmVar12 = DVar1;
              }
            }
            else {
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
              *pmVar12 = DIAG_IGNORE;
            }
            bVar3 = false;
          }
          else {
            cmSystemTools::Error("No warning name provided.",(char *)0x0,(char *)0x0,(char *)0x0);
            this_local._7_1_ = 0;
            bVar3 = true;
          }
          std::__cxx11::string::~string((string *)&nameStartPosition);
        }
        else {
          arg._0_4_ = (uint)arg + 1;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if ((uint)arg < sVar5) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg);
            std::__cxx11::string::operator=
                      ((string *)(name.field_2._M_local_buf + 8),(string *)pvVar8);
            goto LAB_0024a42c;
          }
          cmSystemTools::Error
                    ("-W must be followed with [no-]<name>.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar3 = true;
        }
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
        if (bVar3) goto LAB_0024adbd;
      }
      else {
        lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0x785aa3);
        if (lVar6 == 0) {
          std::__cxx11::string::substr((ulong)&regex.progsize,entry.field_2._8_8_);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
LAB_0024a824:
            cmsys::Glob::PatternToRegex
                      ((string *)
                       &entriesToDelete.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&regex.progsize
                       ,true,true);
            pcVar10 = (char *)std::__cxx11::string::c_str();
            cmsys::RegularExpression::RegularExpression((RegularExpression *)local_230,pcVar10);
            std::__cxx11::string::~string
                      ((string *)
                       &entriesToDelete.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&cacheKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmState::GetCacheEntryKeys_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range5,this->State);
            __end5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range5);
            ck = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range5);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&ck), bVar3) {
              pbVar14 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end5);
              CVar4 = cmState::GetCacheEntryType(this->State,pbVar14);
              if ((CVar4 != STATIC) &&
                 (bVar3 = cmsys::RegularExpression::find((RegularExpression *)local_230,pbVar14),
                 bVar3)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cacheKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar14);
              }
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end5);
            }
            this_00 = &cacheKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __end5_1 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)this_00);
            currentEntry = (string *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)this_00);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end5_1,
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&currentEntry), bVar3) {
              pbVar14 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end5_1);
              cmState::RemoveCacheEntry(this->State,pbVar14);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end5_1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range5);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cacheKeys.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_230);
            bVar3 = false;
          }
          else {
            arg._0_4_ = (uint)arg + 1;
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if ((uint)arg < sVar5) {
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)arg);
              std::__cxx11::string::operator=((string *)&regex.progsize,(string *)pvVar8);
              goto LAB_0024a824;
            }
            cmSystemTools::Error
                      ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
            this_local._7_1_ = 0;
            bVar3 = true;
          }
          std::__cxx11::string::~string((string *)&regex.progsize);
          if (bVar3) goto LAB_0024adbd;
        }
        else {
          lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0x785ac4);
          if (lVar6 == 0) {
            std::__cxx11::string::substr((ulong)((long)&path_1.field_2 + 8),entry.field_2._8_8_);
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
LAB_0024abb1:
              poVar11 = std::operator<<((ostream *)&std::cout,"loading initial cache file ");
              poVar11 = std::operator<<(poVar11,(string *)(path_1.field_2._M_local_buf + 8));
              std::operator<<(poVar11,"\n");
              ReadListFile(this,args,(string *)((long)&path_1.field_2 + 8));
              bVar3 = false;
            }
            else {
              arg._0_4_ = (uint)arg + 1;
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(args);
              if ((uint)arg < sVar5) {
                pvVar8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)(uint)arg);
                std::__cxx11::string::operator=
                          ((string *)(path_1.field_2._M_local_buf + 8),(string *)pvVar8);
                goto LAB_0024abb1;
              }
              cmSystemTools::Error
                        ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
              this_local._7_1_ = 0;
              bVar3 = true;
            }
            std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
            if (bVar3) goto LAB_0024adbd;
          }
          else {
            lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0x785b07);
            if (lVar6 == 0) {
              arg._0_4_ = (uint)arg + 1;
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(args);
              if (sVar5 <= (uint)arg) {
                cmSystemTools::Error
                          ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0
                          );
                this_local._7_1_ = 0;
                goto LAB_0024adbd;
              }
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)arg);
              std::__cxx11::string::string((string *)local_308,(string *)pvVar8);
              uVar7 = std::__cxx11::string::empty();
              bVar3 = (uVar7 & 1) != 0;
              if (bVar3) {
                cmSystemTools::Error
                          ("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
                this_local._7_1_ = 0;
              }
              else {
                GetProjectCommandsInScriptMode(this->State);
                ReadListFile(this,args,(string *)local_308);
              }
              std::__cxx11::string::~string((string *)local_308);
              if (bVar3) goto LAB_0024adbd;
            }
            else {
              lVar6 = std::__cxx11::string::find((char *)entry.field_2._8_8_,0x785b2e);
              if (lVar6 == 0) {
                bVar2 = true;
              }
            }
          }
        }
      }
    }
    arg._0_4_ = (uint)arg + 1;
  } while( true );
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-D", 0) == 0) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
        }
      }
      std::string var, value;
      cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
      if (cmState::ParseCacheEntry(entry, var, value, type)) {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if (this->WarnUnusedCli) {
          if (const std::string* v =
                this->State->GetInitializedCacheValue(var)) {
            haveValue = true;
            cachedValue = *v;
          }
        }

        this->AddCacheEntry(var, value.c_str(),
                            "No help, variable specified on the command line.",
                            type);

        if (this->WarnUnusedCli) {
          if (!haveValue ||
              cachedValue != *this->State->GetInitializedCacheValue(var)) {
            this->WatchUnusedCli(var);
          }
        }
      } else {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
    } else if (cmHasLiteralPrefix(arg, "-W")) {
      std::string entry = arg.substr(2);
      if (entry.empty()) {
        ++i;
        if (i < args.size()) {
          entry = args[i];
        } else {
          cmSystemTools::Error("-W must be followed with [no-]<name>.");
          return false;
        }
      }

      std::string name;
      bool foundNo = false;
      bool foundError = false;
      unsigned int nameStartPosition = 0;

      if (entry.find("no-", nameStartPosition) == 0) {
        foundNo = true;
        nameStartPosition += 3;
      }

      if (entry.find("error=", nameStartPosition) == 0) {
        foundError = true;
        nameStartPosition += 6;
      }

      name = entry.substr(nameStartPosition);
      if (name.empty()) {
        cmSystemTools::Error("No warning name provided.");
        return false;
      }

      if (!foundNo && !foundError) {
        // -W<name>
        this->DiagLevels[name] = std::max(this->DiagLevels[name], DIAG_WARN);
      } else if (foundNo && !foundError) {
        // -Wno<name>
        this->DiagLevels[name] = DIAG_IGNORE;
      } else if (!foundNo && foundError) {
        // -Werror=<name>
        this->DiagLevels[name] = DIAG_ERROR;
      } else {
        // -Wno-error=<name>
        this->DiagLevels[name] = std::min(this->DiagLevels[name], DIAG_WARN);
      }
    } else if (arg.find("-U", 0) == 0) {
      std::string entryPattern = arg.substr(2);
      if (entryPattern.empty()) {
        ++i;
        if (i < args.size()) {
          entryPattern = args[i];
        } else {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
        }
      }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      // go through all cache entries and collect the vars which will be
      // removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::string const& ck : cacheKeys) {
        cmStateEnums::CacheEntryType t = this->State->GetCacheEntryType(ck);
        if (t != cmStateEnums::STATIC) {
          if (regex.find(ck)) {
            entriesToDelete.push_back(ck);
          }
        }
      }

      // now remove them from the cache
      for (std::string const& currentEntry : entriesToDelete) {
        this->State->RemoveCacheEntry(currentEntry);
      }
    } else if (arg.find("-C", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i < args.size()) {
          path = args[i];
        } else {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
        }
      }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path);
    } else if (arg.find("-P", 0) == 0) {
      i++;
      if (i >= args.size()) {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
      }
      std::string path = args[i];
      if (path.empty()) {
        cmSystemTools::Error("No cmake script provided.");
        return false;
      }
      // Register fake project commands that hint misuse in script mode.
      GetProjectCommandsInScriptMode(this->State);
      this->ReadListFile(args, path);
    } else if (arg.find("--find-package", 0) == 0) {
      findPackageMode = true;
    }
  }

  if (findPackageMode) {
    return this->FindPackage(args);
  }

  return true;
}